

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O0

Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> * __thiscall
Kernel::RenderMonom::operator()
          (RenderMonom *this,PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *x)

{
  bool bVar1;
  Stack<Kernel::PolyNf> *this_00;
  size_t sVar2;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *pSVar3;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_RDI;
  PolyNf *x_1;
  PolyNf *__end0;
  PolyNf *__begin0;
  Stack<Kernel::PolyNf> *__range3;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> cur;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> out;
  Stack<Kernel::PolyNf> *factors;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
  *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
  *in_stack_fffffffffffffeb8;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
  *in_stack_fffffffffffffec0;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this_01;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_fffffffffffffee8;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *local_a0;
  
  this_01 = in_RDI;
  this_00 = Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
            operator*((Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)0x924ecd);
  Lib::Stack<Kernel::PolyNf>::sort<std::less<Kernel::PolyNf>>(this_00);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
            (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
  sVar2 = Lib::Stack<Kernel::PolyNf>::size(this_00);
  if (sVar2 != 0) {
    Lib::Stack<Kernel::PolyNf>::operator[](this_00,0);
    PolyNf::PolyNf((PolyNf *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (PolyNf *)in_stack_fffffffffffffea8);
    MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactor
              ((MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               in_stack_fffffffffffffec0,(PolyNf *)in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb4);
    local_a0 = (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
               Lib::Stack<Kernel::PolyNf>::begin(this_00);
    in_stack_fffffffffffffec0 = local_a0;
    pSVar3 = (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
             Lib::Stack<Kernel::PolyNf>::end(this_00);
    in_stack_fffffffffffffeb8 = pSVar3;
    for (; local_a0 != pSVar3;
        local_a0 = (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
                   &local_a0->_end) {
      bVar1 = Kernel::operator==((PolyNf *)
                                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                 (PolyNf *)in_stack_fffffffffffffea8);
      in_stack_fffffffffffffeb4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeb4);
      if (!bVar1) {
        MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactor
                  ((MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   in_stack_fffffffffffffea8);
        Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::push
                  (in_stack_fffffffffffffec0,
                   (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   in_stack_fffffffffffffeb8);
        PolyNf::operator=((PolyNf *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          (PolyNf *)in_stack_fffffffffffffea8);
      }
    }
    MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactor
              ((MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               in_stack_fffffffffffffea8);
    Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::push
              (in_stack_fffffffffffffec0,
               (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
               in_stack_fffffffffffffeb8);
  }
  IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)in_stack_fffffffffffffec0,
             (IntegerConstantType *)in_stack_fffffffffffffeb8);
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactors
            ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
            );
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            (in_stack_fffffffffffffee8);
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
            (this_01,&in_RDI->numeral,
             (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
              *)in_stack_fffffffffffffec0);
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~MonomFactors
            ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x9250fd);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x925107);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::~Stack
            ((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  return this_01;
}

Assistant:

Monom<NumTraits> operator()(PreMonom<NumTraits>&& x) const
  {
    using Monom        = Monom       <NumTraits>;

    auto& factors = *x.factors;
    factors.sort();

    Stack<MonomFactor<NumTraits>> out;

    if (factors.size() > 0) {
      auto cur = MonomFactor<NumTraits>(factors[0], 0);
      for (auto& x : factors) {
        if (x == cur.term) {
          cur.power++;
        } else {
          out.push(cur);
          cur.term = x;
          cur.power = 1;
        }
      }
      out.push(cur);
    }
    return Monom(std::move(x.numeral), perfect(MonomFactors<NumTraits>(std::move(out))));
  }